

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_VisMF.cpp
# Opt level: O0

Long amrex::VisMF::WriteOnlyHeader(FabArray<amrex::FArrayBox> *mf,string *mf_name,How how)

{
  reference this;
  Long LVar1;
  undefined4 in_EDX;
  Header *in_RSI;
  int coordinatorProc;
  FabOnDisk *fod;
  iterator __end1;
  iterator __begin1;
  Vector<amrex::VisMF::FabOnDisk,_std::allocator<amrex::VisMF::FabOnDisk>_> *__range1;
  Header hdr;
  bool calcMinMax;
  Long bytesWritten;
  vector<amrex::VisMF::FabOnDisk,_std::allocator<amrex::VisMF::FabOnDisk>_>
  *in_stack_fffffffffffffe38;
  __normal_iterator<amrex::VisMF::FabOnDisk_*,_std::vector<amrex::VisMF::FabOnDisk,_std::allocator<amrex::VisMF::FabOnDisk>_>_>
  *in_stack_fffffffffffffe40;
  __normal_iterator<amrex::VisMF::FabOnDisk_*,_std::vector<amrex::VisMF::FabOnDisk,_std::allocator<amrex::VisMF::FabOnDisk>_>_>
  local_170;
  undefined1 *local_168;
  IntVect local_15c;
  undefined4 local_148;
  int local_144 [2];
  int local_13c;
  undefined1 auStack_d0 [168];
  MPI_Comm in_stack_ffffffffffffffd8;
  bool bVar2;
  long lVar3;
  undefined4 in_stack_ffffffffffffffe8;
  
  lVar3 = 0;
  bVar2 = false;
  ParallelDescriptor::Communicator();
  Header::Header(in_RSI,(FabArray<amrex::FArrayBox> *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),
                 (How)((ulong)lVar3 >> 0x20),(Version)lVar3,bVar2,in_stack_ffffffffffffffd8);
  local_148 = 0;
  IntVect::IntVect(&local_15c,0,0,0);
  local_144[0] = local_15c.vect[0];
  local_144[1] = local_15c.vect[1];
  local_13c = local_15c.vect[2];
  local_168 = auStack_d0;
  local_170._M_current =
       (FabOnDisk *)
       std::vector<amrex::VisMF::FabOnDisk,_std::allocator<amrex::VisMF::FabOnDisk>_>::begin
                 (in_stack_fffffffffffffe38);
  std::vector<amrex::VisMF::FabOnDisk,_std::allocator<amrex::VisMF::FabOnDisk>_>::end
            (in_stack_fffffffffffffe38);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (in_stack_fffffffffffffe40,
                       (__normal_iterator<amrex::VisMF::FabOnDisk_*,_std::vector<amrex::VisMF::FabOnDisk,_std::allocator<amrex::VisMF::FabOnDisk>_>_>
                        *)in_stack_fffffffffffffe38);
    if (!bVar2) break;
    this = __gnu_cxx::
           __normal_iterator<amrex::VisMF::FabOnDisk_*,_std::vector<amrex::VisMF::FabOnDisk,_std::allocator<amrex::VisMF::FabOnDisk>_>_>
           ::operator*(&local_170);
    std::__cxx11::string::operator=((string *)this,"Not Saved");
    this->m_head = -1;
    __gnu_cxx::
    __normal_iterator<amrex::VisMF::FabOnDisk_*,_std::vector<amrex::VisMF::FabOnDisk,_std::allocator<amrex::VisMF::FabOnDisk>_>_>
    ::operator++(&local_170);
  }
  ParallelDescriptor::IOProcessorNumber();
  ParallelDescriptor::Communicator();
  LVar1 = WriteHeader((string *)__range1,(Header *)__begin1._M_current,__end1._M_current._4_4_,
                      (MPI_Comm)__end1._M_current);
  lVar3 = LVar1 + lVar3;
  Header::~Header(in_RSI);
  return lVar3;
}

Assistant:

Long
VisMF::WriteOnlyHeader (const FabArray<FArrayBox> & mf,
                        const std::string         & mf_name,
                        VisMF::How                  how)
{
//    BL_PROFILE("VisMF::WriteOnlyHeader(FabArray)");
    BL_ASSERT(mf_name[mf_name.length() - 1] != '/');
    BL_ASSERT(currentVersion != VisMF::Header::Undefined_v1);


    Long bytesWritten(0);

    // Construct header for empty MultiFab
    bool calcMinMax(false);
    VisMF::Header hdr(mf, how, currentVersion, calcMinMax);

    // We are saving NO data => nComp = 0, nGrow = {0, 0, 0}
    hdr.m_ncomp = 0;
    hdr.m_ngrow = IntVect{AMREX_D_DECL(0, 0, 0)};

    // FabOnDisk list is uninitialized => initialize it here
    for(VisMF::FabOnDisk & fod : hdr.m_fod){
        fod.m_name = "Not Saved";
        fod.m_head = -1;
    }

    // Write header on the IOProcessorNumber
    int coordinatorProc(ParallelDescriptor::IOProcessorNumber());
    bytesWritten += VisMF::WriteHeader(mf_name, hdr, coordinatorProc);

    return bytesWritten;
}